

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O2

Enum __thiscall ViconDataStreamSDK::Core::VClient::GetCameraCount(VClient *this,uint *o_rCount)

{
  Enum EVar1;
  bool bVar2;
  Enum GetResult;
  scoped_lock Lock;
  Enum local_24;
  unique_lock<boost::recursive_mutex> local_20;
  
  boost::unique_lock<boost::recursive_mutex>::unique_lock(&local_20,&this->m_FrameMutex);
  local_24 = Success;
  bVar2 = InitGet<unsigned_int>(this,&local_24,o_rCount);
  EVar1 = local_24;
  if (bVar2) {
    *o_rCount = (uint)(((long)(this->m_LatestFrame).m_Cameras.
                              super__Vector_base<ViconCGStream::VCameraInfo,_std::allocator<ViconCGStream::VCameraInfo>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_LatestFrame).m_Cameras.
                             super__Vector_base<ViconCGStream::VCameraInfo,_std::allocator<ViconCGStream::VCameraInfo>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0xa0);
  }
  boost::unique_lock<boost::recursive_mutex>::~unique_lock(&local_20);
  return EVar1;
}

Assistant:

Result::Enum VClient::GetCameraCount( unsigned int & o_rCount ) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );
  
  Result::Enum GetResult = Result::Success;
  if ( InitGet( GetResult, o_rCount ) )
  {
    o_rCount = static_cast< unsigned int >( m_LatestFrame.m_Cameras.size() );
  }
  return GetResult;
}